

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmp.hpp
# Opt level: O2

vector<float,_std::allocator<float>_> *
RGB2HSI(vector<float,_std::allocator<float>_> *__return_storage_ptr__,float r,float g,float b)

{
  undefined1 auVar1 [16];
  __normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_> _Var2;
  float fVar3;
  undefined4 in_XMM0_Db;
  undefined4 in_XMM0_Dc;
  undefined4 in_XMM0_Dd;
  undefined4 in_XMM1_Db;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  float fVar6;
  undefined4 in_XMM2_Db;
  float fVar7;
  double dVar8;
  float fVar9;
  float fVar10;
  initializer_list<float> __l;
  initializer_list<float> __l_00;
  allocator_type local_7d;
  float local_7c;
  undefined8 local_78;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  float local_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  float local_58;
  undefined4 uStack_54;
  float local_48;
  undefined4 uStack_44;
  float local_34;
  float local_30;
  float local_2c;
  vector<float,_std::allocator<float>_> rgb;
  
  local_78 = (double)CONCAT44(in_XMM0_Db,r);
  __l._M_len = 3;
  __l._M_array = &local_34;
  uStack_70 = in_XMM0_Dc;
  uStack_6c = in_XMM0_Dd;
  local_58 = g;
  uStack_54 = in_XMM1_Db;
  local_48 = b;
  uStack_44 = in_XMM2_Db;
  local_34 = r;
  local_30 = g;
  local_2c = b;
  std::vector<float,_std::allocator<float>_>::vector(&rgb,__l,&local_7d);
  _Var2 = std::
          __min_element<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>,__gnu_cxx::__ops::_Iter_less_iter>
                    (rgb.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     rgb.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_finish);
  auVar5._4_4_ = uStack_54;
  auVar5._0_4_ = local_58;
  fVar10 = (float)local_78 + local_58 + local_48;
  fVar9 = fVar10 / 3.0;
  fVar3 = 0.0;
  fVar6 = 0.0;
  if (0.0 < fVar9) {
    fVar6 = 1.0 - *_Var2._M_current / fVar9;
  }
  fVar7 = 0.0;
  if (1e-08 <= fVar6) {
    fVar7 = fVar6;
  }
  if (0.0 < fVar7) {
    auVar5._8_4_ = uStack_54;
    auVar5._12_4_ = uStack_44;
    auVar4._8_8_ = auVar5._8_8_;
    auVar4._4_4_ = local_48;
    auVar4._0_4_ = local_58;
    auVar1._4_4_ = fVar10;
    auVar1._0_4_ = fVar10;
    auVar1._8_4_ = fVar10;
    auVar1._12_4_ = fVar10;
    auVar5 = divps(auVar4,auVar1);
    fVar3 = (float)local_78 / fVar10 - auVar5._0_4_;
    fVar6 = (float)local_78 / fVar10 - auVar5._4_4_;
    dVar8 = (double)(fVar3 + fVar6) * 0.5;
    fVar3 = fVar3 * fVar3 + (auVar5._0_4_ - auVar5._4_4_) * fVar6;
    uStack_64 = local_78._4_4_;
    uStack_60 = uStack_70;
    uStack_5c = uStack_6c;
    local_7c = fVar7;
    local_68 = fVar9;
    if (fVar3 < 0.0) {
      local_78 = dVar8;
      fVar3 = sqrtf(fVar3);
      dVar8 = local_78;
    }
    else {
      fVar3 = SQRT(fVar3);
    }
    dVar8 = acos(dVar8 / (double)fVar3);
    fVar3 = (float)dVar8;
    fVar9 = local_68;
    fVar7 = local_7c;
    if (local_58 < local_48) {
      fVar3 = 6.2831855 - fVar3;
    }
  }
  __l_00._M_len = 3;
  __l_00._M_array = &local_34;
  local_34 = fVar3;
  local_30 = fVar7;
  local_2c = fVar9;
  std::vector<float,_std::allocator<float>_>::vector(__return_storage_ptr__,__l_00,&local_7d);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            (&rgb.super__Vector_base<float,_std::allocator<float>_>);
  return __return_storage_ptr__;
}

Assistant:

inline std::vector<float> RGB2HSI(float r, float g, float b) {
    auto rgb = std::vector<float>({r, g, b});
    auto min = std::min_element(rgb.begin(), rgb.end());

    float h = 0;
    float s = 0;
    float i = (r + g + b) / 3;

    float rn = r / (r + g + b);
    float gn = g / (r + g + b);
    float bn = b / (r + g + b);

    if (i > 0) s = 1 - (rgb[std::distance(rgb.begin(), min)] / i);
    if (s < 1e-8) s = 0;
    if (s > 0) {
        h = acos((0.5 * ((rn - gn) + (rn - bn))) / (std::sqrt((rn - gn) * (rn - gn) + (rn - bn) * (gn - bn))));
        if (b > g) h = 2 * M_PI - h;
    }
    return {h, s, i};
}